

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void __thiscall AGSSockAPI::Thread::start(Thread *this)

{
  int iVar1;
  Lock local_18;
  Lock lock;
  Thread *this_local;
  
  lock.mutex_ = (Mutex *)this;
  if (this->data != (Data *)0x0) {
    Mutex::Lock::Lock(&local_18,&this->data->mutex);
    if ((this->data->active & 1U) == 0) {
      iVar1 = pthread_create(&this->data->thread,(pthread_attr_t *)0x0,Data::Function,this);
      this->data->active = (bool)((iVar1 != 0 ^ 0xffU) & 1);
    }
    Mutex::Lock::~Lock(&local_18);
    return;
  }
  __assert_fail("data != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/API.cpp"
                ,0xe2,"void AGSSockAPI::Thread::start()");
}

Assistant:

void Thread::start()
{
	assert(data != nullptr);

	{
		Mutex::Lock lock(data->mutex);

		if (!data->active)
		{
		#ifdef _WIN32
			data->handle = CreateThread(nullptr, 0,
				Data::Function, static_cast<LPVOID> (this), 0, nullptr);
			data->active = (data->handle != nullptr);
		#else
			data->active = !pthread_create(&data->thread, nullptr,
				Data::Function, static_cast<void *> (this));
		#endif
		}
	}
}